

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O1

Graph * Omega_h::unmap_graph(Graph *__return_storage_ptr__,LOs *a2b,Graph *b2c)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  void *pvVar4;
  Alloc *pAVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined4 *puVar9;
  size_t sVar10;
  LOs b2bc;
  Write<int> ac2c;
  LOs a2ac;
  LOs bc2c;
  type f;
  Read<int> a_degrees;
  LOs b_degrees;
  Alloc *local_210;
  Write<int> local_200;
  Read<int> local_1f0;
  Alloc *local_1e0;
  void *local_1d8;
  string local_1d0;
  Alloc *local_1b0;
  void *local_1a8;
  Alloc *local_1a0;
  void *local_198;
  Alloc *local_190;
  void *local_188;
  Omega_h *local_180;
  LOs local_178;
  Read<int> local_168;
  LOs local_158;
  Alloc *local_148;
  void *local_140;
  Alloc *local_138;
  void *local_130;
  Alloc *local_128;
  void *local_120;
  Alloc *local_118;
  void *local_110;
  Alloc *local_108;
  void *local_100;
  Write<int> local_f8;
  Read<int> local_e8;
  LOs local_d8;
  Alloc *local_c8;
  void *local_c0;
  Alloc *local_b8;
  void *pvStack_b0;
  Alloc *local_a8;
  void *pvStack_a0;
  Alloc *local_98;
  void *pvStack_90;
  Alloc *local_88;
  void *pvStack_80;
  Alloc *local_78;
  void *pvStack_70;
  Read<signed_char> local_60;
  Write<int> local_50;
  Alloc *local_40;
  void *local_38;
  
  local_210 = (b2c->a2ab).write_.shared_alloc_.alloc;
  if (((ulong)local_210 & 7) == 0 && local_210 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_210 = (Alloc *)(local_210->size * 8 + 1);
    }
    else {
      local_210->use_count = local_210->use_count + 1;
    }
  }
  pvVar4 = (b2c->a2ab).write_.shared_alloc_.direct_ptr;
  local_1e0 = (b2c->ab2b).write_.shared_alloc_.alloc;
  if (((ulong)local_1e0 & 7) == 0 && local_1e0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1e0 = (Alloc *)(local_1e0->size * 8 + 1);
    }
    else {
      local_1e0->use_count = local_1e0->use_count + 1;
    }
  }
  local_1d8 = (b2c->ab2b).write_.shared_alloc_.direct_ptr;
  local_158.write_.shared_alloc_.alloc = local_210;
  if (((ulong)local_210 & 7) == 0 && local_210 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_158.write_.shared_alloc_.alloc = (Alloc *)(local_210->size * 8 + 1);
    }
    else {
      local_210->use_count = local_210->use_count + 1;
    }
  }
  paVar2 = &local_1d0.field_2;
  local_1d0._M_dataplus._M_p = (pointer)paVar2;
  local_158.write_.shared_alloc_.direct_ptr = pvVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
  get_degrees((Omega_h *)&local_40,&local_158,&local_1d0);
  local_180 = (Omega_h *)&local_40;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d0._M_dataplus._M_p,(ulong)(local_1d0.field_2._M_allocated_capacity + 1))
    ;
  }
  pAVar5 = local_158.write_.shared_alloc_.alloc;
  if (((ulong)local_158.write_.shared_alloc_.alloc & 7) == 0 &&
      local_158.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_158.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_158.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  local_d8.write_.shared_alloc_.alloc = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d8.write_.shared_alloc_.alloc =
           (Alloc *)((local_d8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_d8.write_.shared_alloc_.alloc)->use_count =
           (local_d8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_d8.write_.shared_alloc_.direct_ptr = (a2b->write_).shared_alloc_.direct_ptr;
  local_e8.write_.shared_alloc_.alloc = local_40;
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e8.write_.shared_alloc_.alloc = (Alloc *)(local_40->size * 8 + 1);
    }
    else {
      local_40->use_count = local_40->use_count + 1;
    }
  }
  local_e8.write_.shared_alloc_.direct_ptr = local_38;
  unmap<int>((Omega_h *)&local_50,&local_d8,&local_e8,1);
  read<int>((Omega_h *)&local_c8,&local_50);
  if (((ulong)local_50.shared_alloc_.alloc & 7) == 0 && local_50.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_50.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50.shared_alloc_.alloc);
      operator_delete(local_50.shared_alloc_.alloc,0x48);
    }
  }
  pAVar5 = local_e8.write_.shared_alloc_.alloc;
  if (((ulong)local_e8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_e8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_e8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_e8.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  pAVar5 = local_d8.write_.shared_alloc_.alloc;
  if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_d8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_d8.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  local_168.write_.shared_alloc_.alloc = local_c8;
  if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_168.write_.shared_alloc_.alloc = (Alloc *)(local_c8->size * 8 + 1);
    }
    else {
      local_c8->use_count = local_c8->use_count + 1;
    }
  }
  local_168.write_.shared_alloc_.direct_ptr = local_c0;
  local_1d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
  offset_scan<int>((Omega_h *)&local_1f0,&local_168,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d0._M_dataplus._M_p,(ulong)(local_1d0.field_2._M_allocated_capacity + 1))
    ;
  }
  pAVar5 = local_168.write_.shared_alloc_.alloc;
  if (((ulong)local_168.write_.shared_alloc_.alloc & 7) == 0 &&
      local_168.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_168.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_168.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  pAVar5 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar5 & 1) == 0) {
    sVar10 = pAVar5->size;
  }
  else {
    sVar10 = (ulong)pAVar5 >> 3;
  }
  iVar6 = Read<int>::last(&local_1f0);
  local_1d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
  Write<int>::Write(&local_200,iVar6,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d0._M_dataplus._M_p,(ulong)(local_1d0.field_2._M_allocated_capacity + 1))
    ;
  }
  local_148 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_148 = (Alloc *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)&local_148->size)->_M_allocated_capacity * 8 + 1);
    }
    else {
      local_148->use_count = local_148->use_count + 1;
    }
  }
  local_140 = (a2b->write_).shared_alloc_.direct_ptr;
  local_138 = local_210;
  if (((ulong)local_210 & 7) == 0 && local_210 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_138 = (Alloc *)(local_210->size * 8 + 1);
    }
    else {
      local_210->use_count = local_210->use_count + 1;
    }
  }
  local_128 = local_1f0.write_.shared_alloc_.alloc;
  if (((ulong)local_1f0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_128 = (Alloc *)((local_1f0.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1f0.write_.shared_alloc_.alloc)->use_count =
           (local_1f0.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_120 = local_1f0.write_.shared_alloc_.direct_ptr;
  local_118 = local_200.shared_alloc_.alloc;
  if (((ulong)local_200.shared_alloc_.alloc & 7) == 0 &&
      local_200.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_118 = (Alloc *)((local_200.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_200.shared_alloc_.alloc)->use_count = (local_200.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_110 = local_200.shared_alloc_.direct_ptr;
  local_108 = local_1e0;
  if (((ulong)local_1e0 & 7) == 0 && local_1e0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_108 = (Alloc *)(local_1e0->size * 8 + 1);
    }
    else {
      local_1e0->use_count = local_1e0->use_count + 1;
    }
  }
  local_100 = local_1d8;
  local_b8 = local_148;
  if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b8 = (Alloc *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)&local_148->size)->_M_allocated_capacity * 8 + 1);
    }
    else {
      local_148->use_count = local_148->use_count + 1;
    }
  }
  local_a8 = local_138;
  if (((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8 = (Alloc *)(local_138->size * 8 + 1);
    }
    else {
      local_138->use_count = local_138->use_count + 1;
    }
  }
  local_98 = local_128;
  if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98 = (Alloc *)(local_128->size * 8 + 1);
    }
    else {
      local_128->use_count = local_128->use_count + 1;
    }
  }
  pvStack_90 = local_1f0.write_.shared_alloc_.direct_ptr;
  local_88 = local_118;
  if (((ulong)local_118 & 7) == 0 && local_118 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88 = (Alloc *)(local_118->size * 8 + 1);
    }
    else {
      local_118->use_count = local_118->use_count + 1;
    }
  }
  pvStack_80 = local_200.shared_alloc_.direct_ptr;
  local_78 = local_108;
  if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_78 = (Alloc *)(local_108->size * 8 + 1);
    }
    else {
      local_108->use_count = local_108->use_count + 1;
    }
  }
  pvStack_70 = local_1d8;
  iVar6 = (int)(sVar10 >> 2);
  local_130 = pvVar4;
  pvStack_b0 = local_140;
  pvStack_a0 = pvVar4;
  if (0 < iVar6) {
    local_1d0._M_dataplus._M_p = (pointer)local_b8;
    if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
      local_b8->use_count = local_b8->use_count + -1;
      local_1d0._M_dataplus._M_p =
           (pointer)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&local_b8->size)->_M_allocated_capacity * 8 + 1);
    }
    local_b8 = (Alloc *)0x0;
    pvStack_b0 = (void *)0x0;
    local_1d0.field_2._M_allocated_capacity = (size_type)local_a8;
    if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
      local_a8->use_count = local_a8->use_count + -1;
      local_1d0.field_2._M_allocated_capacity = local_a8->size * 8 + 1;
    }
    local_a8 = (Alloc *)0x0;
    pvStack_a0 = (void *)0x0;
    local_1b0 = local_98;
    local_1a8 = local_1f0.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
      local_98->use_count = local_98->use_count + -1;
      local_1b0 = (Alloc *)(local_98->size * 8 + 1);
    }
    local_98 = (Alloc *)0x0;
    pvStack_90 = (void *)0x0;
    local_1a0 = local_88;
    local_198 = local_200.shared_alloc_.direct_ptr;
    if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
      local_88->use_count = local_88->use_count + -1;
      local_1a0 = (Alloc *)(local_88->size * 8 + 1);
    }
    local_88 = (Alloc *)0x0;
    pvStack_80 = (void *)0x0;
    local_190 = local_78;
    local_188 = local_1d8;
    if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
      local_78->use_count = local_78->use_count + -1;
      local_190 = (Alloc *)(local_78->size * 8 + 1);
    }
    local_78 = (Alloc *)0x0;
    pvStack_70 = (void *)0x0;
    entering_parallel = '\0';
    lVar7 = 0;
    do {
      iVar3 = *(int *)((long)local_1f0.write_.shared_alloc_.direct_ptr + lVar7 * 4);
      lVar8 = (long)iVar3;
      if (iVar3 < *(int *)((long)local_1f0.write_.shared_alloc_.direct_ptr + lVar7 * 4 + 4)) {
        puVar9 = (undefined4 *)
                 ((long)local_1d8 +
                 (long)*(int *)((long)pvVar4 + (long)*(int *)((long)local_140 + lVar7 * 4) * 4) * 4)
        ;
        do {
          *(undefined4 *)((long)local_200.shared_alloc_.direct_ptr + lVar8 * 4) = *puVar9;
          lVar8 = lVar8 + 1;
          puVar9 = puVar9 + 1;
        } while (lVar8 < *(int *)((long)local_1f0.write_.shared_alloc_.direct_ptr + lVar7 * 4 + 4));
      }
      lVar7 = lVar7 + 1;
    } while ((int)lVar7 != iVar6);
    local_1d0._M_string_length = (size_type)local_140;
    local_1d0.field_2._8_8_ = pvVar4;
    unmap_graph(Omega_h::Read<int>,Omega_h::Graph)::$_0::~__0((__0 *)&local_1d0);
  }
  unmap_graph(Omega_h::Read<int>,Omega_h::Graph)::$_0::~__0((__0 *)&local_b8);
  local_178.write_.shared_alloc_.alloc = local_1f0.write_.shared_alloc_.alloc;
  if (((ulong)local_1f0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_178.write_.shared_alloc_.alloc =
           (Alloc *)((local_1f0.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1f0.write_.shared_alloc_.alloc)->use_count =
           (local_1f0.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_178.write_.shared_alloc_.direct_ptr = local_1f0.write_.shared_alloc_.direct_ptr;
  local_f8.shared_alloc_.alloc = local_200.shared_alloc_.alloc;
  if (((ulong)local_200.shared_alloc_.alloc & 7) == 0 &&
      local_200.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8.shared_alloc_.alloc = (Alloc *)((local_200.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_200.shared_alloc_.alloc)->use_count = (local_200.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_f8.shared_alloc_.direct_ptr = local_200.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_60,&local_f8);
  Graph::Graph(__return_storage_ptr__,&local_178,(LOs *)&local_60);
  if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_60.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
      operator_delete(local_60.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar5 = local_f8.shared_alloc_.alloc;
  if (((ulong)local_f8.shared_alloc_.alloc & 7) == 0 && local_f8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_f8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_f8.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  pAVar5 = local_178.write_.shared_alloc_.alloc;
  if (((ulong)local_178.write_.shared_alloc_.alloc & 7) == 0 &&
      local_178.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_178.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_178.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  unmap_graph(Omega_h::Read<int>,Omega_h::Graph)::$_0::~__0((__0 *)&local_148);
  if (((ulong)local_200.shared_alloc_.alloc & 7) == 0 &&
      local_200.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_200.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_200.shared_alloc_.alloc);
      operator_delete(local_200.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_1f0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1f0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1f0.write_.shared_alloc_.alloc);
      operator_delete(local_1f0.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
    piVar1 = &local_c8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_c8);
      operator_delete(local_c8,0x48);
    }
  }
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    piVar1 = &local_40->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40);
      operator_delete(local_40,0x48);
    }
  }
  pAVar5 = local_1e0;
  if (((ulong)local_1e0 & 7) == 0 && local_1e0 != (Alloc *)0x0) {
    piVar1 = &local_1e0->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1e0);
      operator_delete(pAVar5,0x48);
    }
  }
  if (((ulong)local_210 & 7) == 0 && local_210 != (Alloc *)0x0) {
    piVar1 = &local_210->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_210);
      operator_delete(local_210,0x48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Graph unmap_graph(LOs a2b, Graph b2c) {
  auto b2bc = b2c.a2ab;
  auto bc2c = b2c.ab2b;
  auto b_degrees = get_degrees(b2bc);
  auto a_degrees = read(unmap(a2b, b_degrees, 1));
  auto a2ac = offset_scan(a_degrees);
  auto na = a2b.size();
  Write<LO> ac2c(a2ac.last());
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto b = a2b[a];
    auto bc = b2bc[b];
    for (auto ac = a2ac[a]; ac < a2ac[a + 1]; ++ac) {
      ac2c[ac] = bc2c[bc++];
    }
  };
  parallel_for(na, f, "unmap_graph");
  return Graph(a2ac, ac2c);
}